

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O2

void __thiscall indigox::Atom::SetElement(Atom *this,Int e)

{
  PeriodicTable_p PT;
  undefined1 auStack_38 [16];
  uint8_t local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  PeriodicTable::GetInstance();
  PeriodicTable::GetElement((PeriodicTable *)auStack_38,local_28);
  std::__shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->element_).super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2> *)auStack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return;
}

Assistant:

void Atom::SetElement(Int e) {
    PeriodicTable_p PT = PeriodicTable::GetInstance();
    element_ = PT->GetElement((uint8_t)e);
  }